

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EndpointInfo.cpp
# Opt level: O2

void __thiscall helics::EndpointInfo::clearQueue(EndpointInfo *this)

{
  handle local_20;
  
  LOCK();
  (this->mAvailableMessages).super___atomic_base<int>._M_i = 0;
  UNLOCK();
  gmlc::libguarded::
  shared_guarded<std::deque<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>,_std::shared_mutex>
  ::lock(&local_20,&this->message_queue);
  std::
  deque<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
  ::clear(local_20.data);
  std::unique_lock<std::shared_mutex>::~unique_lock(&local_20.m_handle_lock);
  return;
}

Assistant:

void EndpointInfo::clearQueue()
{
    mAvailableMessages.store(0);
    message_queue.lock()->clear();
}